

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractspinbox.cpp
# Opt level: O3

void QAbstractSpinBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<Qt::AlignmentFlag> *pQVar1;
  int *piVar2;
  undefined8 uVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  byte bVar7;
  bool bVar8;
  ushort uVar9;
  QFlagsStorage<Qt::AlignmentFlag> QVar10;
  code *UNRECOVERED_JUMPTABLE_00;
  long lVar11;
  ushort uVar12;
  int iVar13;
  QObject *pQVar14;
  undefined8 uVar15;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        iVar13 = 0;
LAB_0047c69f:
        QMetaObject::activate(_o,&staticMetaObject,iVar13,(void **)0x0);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        iVar13 = 1;
        goto LAB_0047c69f;
      }
      break;
    case 2:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1b0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar15 = 1;
LAB_0047c676:
        (*UNRECOVERED_JUMPTABLE_00)(_o,uVar15);
        return;
      }
      break;
    case 3:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1b0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar15 = 0xffffffff;
        goto LAB_0047c676;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        selectAll((QAbstractSpinBox *)_o);
        return;
      }
      break;
    case 5:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)_o + 0x1b8);
      pQVar14 = _o;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_0047c772;
    default:
      goto switchD_0047c518_caseD_3;
    }
    goto LAB_0047c9bf;
  case ReadProperty:
    if (0xb < (uint)_id) goto switchD_0047c518_caseD_3;
    break;
  case WriteProperty:
    if (0xb < (uint)_id) goto switchD_0047c518_caseD_3;
    pQVar1 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
    switch(_id) {
    case 0:
      *(ushort *)(*(long *)(_o + 8) + 0x3d0) =
           ((ushort)*(undefined4 *)(*(long *)(_o + 8) + 0x3d0) & 0xfffb) +
           (ushort)*(byte *)&pQVar1->i * 4;
      goto switchD_0047c518_caseD_3;
    case 1:
      pQVar14 = *(QObject **)(_o + 8);
      *(ushort *)(pQVar14 + 0x3d0) =
           (ushort)*(undefined4 *)(pQVar14 + 0x3d0) & 0xffef | (ushort)*(byte *)&pQVar1->i << 4;
      QWidget::update((QWidget *)_o);
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)pQVar14 + 0x100);
      goto LAB_0047c75b;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QLineEdit::setAlignment(*(QLineEdit **)(*(long *)(_o + 8) + 0x378),(Alignment)pQVar1->i);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setReadOnly((QAbstractSpinBox *)_o,*(bool *)&pQVar1->i);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setButtonSymbols((QAbstractSpinBox *)_o,pQVar1->i);
        return;
      }
      break;
    case 5:
      pQVar14 = *(QObject **)(_o + 8);
      QString::operator=((QString *)(pQVar14 + 0x288),(QString *)pQVar1);
      *(long *)(pQVar14 + 0x368) = -1;
      (**(code **)(*(long *)pQVar14 + 0xf8))(pQVar14);
      UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)pQVar14 + 0xc0);
LAB_0047c75b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0047c772:
        (*UNRECOVERED_JUMPTABLE_00)(pQVar14);
        return;
      }
      break;
    default:
      goto switchD_0047c518_caseD_3;
    case 7:
      lVar11 = *(long *)(_o + 8);
      uVar9 = (ushort)*(byte *)&pQVar1->i << 5;
      uVar12 = (ushort)*(undefined4 *)(lVar11 + 0x3d0) & 0xffdf;
      goto LAB_0047c823;
    case 8:
      ((QFlagsStorage<Qt::AlignmentFlag> *)(*(long *)(_o + 8) + 0x3b8))->i = pQVar1->i;
      goto switchD_0047c518_caseD_3;
    case 10:
      lVar11 = *(long *)(_o + 8);
      uVar9 = (ushort)*(byte *)&pQVar1->i << 6;
      uVar12 = (ushort)*(undefined4 *)(lVar11 + 0x3d0) & 0xffbf;
LAB_0047c823:
      *(ushort *)(lVar11 + 0x3d0) = uVar12 | uVar9;
      goto switchD_0047c518_caseD_3;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setGroupSeparatorShown((QAbstractSpinBox *)_o,*(bool *)&pQVar1->i);
        return;
      }
    }
    goto LAB_0047c9bf;
  default:
    goto switchD_0047c518_caseD_3;
  case IndexOfMethod:
    UNRECOVERED_JUMPTABLE_00 = *_a[1];
    lVar11 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE_00 == editingFinished && lVar11 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (UNRECOVERED_JUMPTABLE_00 == returnPressed && lVar11 == 0) {
      *(undefined4 *)*_a = 1;
    }
    goto switchD_0047c518_caseD_3;
  }
  pQVar1 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
  switch(_id) {
  case 0:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 2;
    break;
  case 1:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 4;
    break;
  case 2:
    QVar10.i = (Int)QLineEdit::alignment(*(QLineEdit **)(*(long *)(_o + 8) + 0x378));
    goto LAB_0047c9a4;
  case 3:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 1;
    break;
  case 4:
    QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x3c0);
    goto LAB_0047c9a4;
  case 5:
    lVar11 = *(long *)(_o + 8);
    piVar2 = *(int **)(lVar11 + 0x288);
    uVar15 = *(undefined8 *)(lVar11 + 0x290);
    uVar3 = *(undefined8 *)(lVar11 + 0x298);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    pQVar4 = *(QArrayData **)pQVar1;
    *(int **)pQVar1 = piVar2;
    *(undefined8 *)(pQVar1 + 2) = uVar15;
    *(undefined8 *)(pQVar1 + 4) = uVar3;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QArrayData::deallocate(pQVar4,2,0x10);
          return;
        }
        goto LAB_0047c9bf;
      }
    }
    goto switchD_0047c518_caseD_3;
  case 6:
    QLineEdit::displayText(&local_30,*(QLineEdit **)(*(long *)(_o + 8) + 0x378));
    pQVar4 = *(QArrayData **)pQVar1;
    *(Data **)pQVar1 = local_30.d.d;
    pcVar5 = *(char16_t **)(pQVar1 + 2);
    *(char16_t **)(pQVar1 + 2) = local_30.d.ptr;
    qVar6 = *(qsizetype *)(pQVar1 + 4);
    *(qsizetype *)(pQVar1 + 4) = local_30.d.size;
    local_30.d.d = (Data *)pQVar4;
    local_30.d.ptr = pcVar5;
    local_30.d.size = qVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    goto switchD_0047c518_caseD_3;
  case 7:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 5;
    break;
  case 8:
    QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x3b8);
LAB_0047c9a4:
    pQVar1->i = QVar10.i;
    goto switchD_0047c518_caseD_3;
  case 9:
    bVar8 = QLineEdit::hasAcceptableInput(*(QLineEdit **)(*(long *)(_o + 8) + 0x378));
    goto LAB_0047c995;
  case 10:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 6;
    break;
  case 0xb:
    *(byte *)&pQVar1->i = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x3d0) >> 9) & 1;
    goto switchD_0047c518_caseD_3;
  }
  bVar8 = (bool)(bVar7 & 1);
LAB_0047c995:
  *(bool *)&pQVar1->i = bVar8;
switchD_0047c518_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0047c9bf:
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractSpinBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->returnPressed(); break;
        case 2: _t->stepUp(); break;
        case 3: _t->stepDown(); break;
        case 4: _t->selectAll(); break;
        case 5: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::returnPressed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 4: *reinterpret_cast<ButtonSymbols*>(_v) = _t->buttonSymbols(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->specialValueText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isAccelerated(); break;
        case 8: *reinterpret_cast<CorrectionMode*>(_v) = _t->correctionMode(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->keyboardTracking(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->isGroupSeparatorShown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setButtonSymbols(*reinterpret_cast<ButtonSymbols*>(_v)); break;
        case 5: _t->setSpecialValueText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setAccelerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setCorrectionMode(*reinterpret_cast<CorrectionMode*>(_v)); break;
        case 10: _t->setKeyboardTracking(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setGroupSeparatorShown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}